

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  bool bVar1;
  size_type sVar2;
  string expr;
  string local_30;
  
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    local_30._M_dataplus._M_p._0_1_ = 0;
    Colour::use(FileName);
    std::__ostream_insert<char,std::char_traits<char>>(this->stream," for: ",6);
    Colour::use(None);
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_30,this->result);
    if (local_30._M_string_length != 0) {
      sVar2 = 0;
      do {
        if (*(char *)(CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) +
                     sVar2) == '\n') {
          *(undefined1 *)
           (CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) + sVar2) =
               0x20;
        }
        sVar2 = sVar2 + 1;
      } while (local_30._M_string_length != sVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this->stream,
               (char *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_),
               local_30._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_) !=
        &local_30.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_30._M_dataplus._M_p._1_7_,local_30._M_dataplus._M_p._0_1_),
                      local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    {
                        Colour colour(dimColour());
                        stream << " for: ";
                    }
                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }